

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read_sharedstrings.c
# Opt level: O2

int sharedstringlist_add_buffer(sharedstringlist *sharedstrings,XML_Char *data,size_t datalen)

{
  size_t sVar1;
  int iVar2;
  XML_Char *__dest;
  XML_Char **ppXVar3;
  
  if (sharedstrings == (sharedstringlist *)0x0) {
    return 1;
  }
  if (data == (XML_Char *)0x0) {
    __dest = (XML_Char *)0x0;
  }
  else {
    __dest = (XML_Char *)malloc(datalen + 1);
    if (__dest == (XML_Char *)0x0) {
      return 2;
    }
    memcpy(__dest,data,datalen);
    __dest[datalen] = '\0';
  }
  ppXVar3 = (XML_Char **)realloc(sharedstrings->strings,sharedstrings->numstrings * 8 + 8);
  if (ppXVar3 == (XML_Char **)0x0) {
    free(__dest);
    iVar2 = 3;
  }
  else {
    sharedstrings->strings = ppXVar3;
    sVar1 = sharedstrings->numstrings;
    sharedstrings->numstrings = sVar1 + 1;
    ppXVar3[sVar1] = __dest;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int sharedstringlist_add_buffer (struct sharedstringlist* sharedstrings, const XML_Char* data, size_t datalen)
{
  XML_Char* s;
  XML_Char** p;
  if (!sharedstrings)
    return 1;
  if (!data) {
    s = NULL;
  } else {
    if ((s = XML_Char_malloc(datalen + 1)) == NULL)
      return 2;
    XML_Char_poscpy(s, 0, data, datalen);
    s[datalen] = 0;
  }
  if ((p = (XML_Char**)realloc(sharedstrings->strings, (sharedstrings->numstrings + 1) * sizeof(sharedstrings->strings[0]))) == NULL) {
    free(s);
    return 3;
  }
  sharedstrings->strings = p;
  sharedstrings->strings[sharedstrings->numstrings++] = s;
  return 0;
}